

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_utils.h
# Opt level: O1

bool __thiscall
auto_array<unsigned_int>::reserve(auto_array<unsigned_int> *this,size_t new_capacity)

{
  ulong uVar1;
  uint *__src;
  uint *__dest;
  
  uVar1 = this->length_;
  if (uVar1 <= new_capacity) {
    __dest = (uint *)operator_new__(-(ulong)(new_capacity >> 0x3e != 0) | new_capacity * 4);
    __src = this->data_;
    if (uVar1 != 0 && __src != (uint *)0x0) {
      memcpy(__dest,__src,uVar1 * 4);
    }
    this->capacity_ = new_capacity;
    if (__src != (uint *)0x0) {
      operator_delete__(__src);
    }
    this->data_ = __dest;
  }
  return uVar1 <= new_capacity;
}

Assistant:

bool reserve(size_t new_capacity)
  {
    if (new_capacity < length_) {
      return false;
    }
    T * new_data = new T[new_capacity];
    if (data_ && length_) {
      PodCopy(new_data, data_, length_);
    }
    capacity_ = new_capacity;
    delete [] data_;
    data_ = new_data;

    return true;
  }